

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::BuildFieldOrExtension
          (DescriptorBuilder *this,FieldDescriptorProto *proto,Descriptor *parent,
          FieldDescriptor *result,bool is_extension,FlatAllocator *alloc)

{
  PointerT<google::protobuf::FeatureSet> pFVar1;
  _Alloc_hider this_00;
  ushort *puVar2;
  double dVar3;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_03;
  undefined8 proto_00;
  undefined8 this_01;
  bool bVar4;
  FieldNameCase FVar5;
  int32_t iVar6;
  long *plVar7;
  _Storage<google::protobuf::internal::DescriptorNames,_true> _Var8;
  size_type *psVar9;
  undefined8 *puVar10;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>_>
  pMVar11;
  OneofDescriptor *pOVar12;
  long lVar13;
  size_t *psVar15;
  EnumValueDescriptor *this_02;
  string *psVar16;
  byte bVar17;
  char cVar18;
  char *pcVar19;
  int64_t iVar20;
  uint uVar21;
  pointer pcVar23;
  AllocatedData this_03;
  string *psVar24;
  undefined1 lower_first;
  char *pcVar25;
  float fVar26;
  optional<google::protobuf::internal::DescriptorNames> oVar27;
  string_view input;
  string_view input_00;
  string_view input_01;
  initializer_list<unsigned_long> sizes;
  initializer_list<unsigned_long> sizes_00;
  string_view name;
  string_view full_name;
  initializer_list<unsigned_long> sizes_01;
  string_view name_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes_00;
  string_view element_name;
  string_view name_01;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view element_name_03;
  string_view element_name_04;
  string_view element_name_05;
  string_view element_name_06;
  string_view element_name_07;
  string_view element_name_08;
  string_view full_name_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes_01;
  string_view element_name_09;
  string_view source;
  string_view element_name_10;
  string_view element_name_11;
  string_view element_name_12;
  string_view option_name;
  string_view name_02;
  FieldDescriptor *result_local;
  Descriptor *parent_local;
  InternalMetadata local_210;
  undefined1 local_208 [48];
  string lowercase_name;
  string camelcase_name;
  string json_name;
  string value;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  string_view local_c0;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *local_b0;
  PointerT<google::protobuf::FeatureSet> pFStack_a8;
  string_view local_a0;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *local_90;
  PointerT<google::protobuf::FeatureSet> pFStack_88;
  string_view local_80;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *local_70;
  PointerT<google::protobuf::SourceCodeInfo> local_68;
  ulong local_60;
  char *local_58;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *local_50;
  PointerT<google::protobuf::FeatureSet> pFStack_48;
  string_view local_40;
  ulong uVar14;
  int iVar22;
  
  if (parent == (Descriptor *)0x0) {
    psVar16 = this->file_->package_;
    local_210.ptr_ = (intptr_t)(psVar16->_M_dataplus)._M_p;
    local_208._24_8_ = psVar16->_M_string_length;
  }
  else {
    pcVar25 = (parent->all_names_).payload_;
    local_208._24_8_ = ZEXT28(*(ushort *)(pcVar25 + 2));
    local_210.ptr_ = (intptr_t)(pcVar25 + ~local_208._24_8_);
  }
  plVar7 = (long *)((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  pFVar1 = (PointerT<google::protobuf::FeatureSet>)*plVar7;
  this_00._M_p = (pointer)plVar7[1];
  psVar24 = (string *)0x0;
  if ((undefined1  [80])((undefined1  [80])proto->field_0 & (undefined1  [80])0x10) !=
      (undefined1  [80])0x0) {
    psVar24 = (string *)
              ((ulong)(proto->field_0)._impl_.json_name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  }
  result_local = result;
  parent_local = parent;
  local_208._0_8_ = this_00._M_p;
  local_208._8_8_ = pFVar1;
  if ((alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).pointers_.payload_.super_Base<char>.value == (PointerT<char>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x229,"has_allocated()");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_d0);
  }
  pcVar25 = "";
  if ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
       *)local_208._24_8_ !=
      (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
       *)0x0) {
    pcVar25 = ".";
  }
  uVar14 = (ulong)((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                    *)local_208._24_8_ !=
                  (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                   *)0x0);
  pcVar23 = this_00._M_p +
            (long)&((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                     *)local_208._24_8_)->pointers_ + uVar14;
  local_208._16_8_ = alloc;
  local_208._32_8_ = proto;
  local_208._40_8_ = this;
  lower_first = is_extension;
  if (psVar24 == (string *)0x0) {
    name_00._M_str = (char *)local_208._24_8_;
    name_00._M_len = (size_t)pFVar1;
    FVar5 = anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::GetFieldNameCase((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                                *)this_00._M_p,name_00);
    this_03 = (AllocatedData)local_208._16_8_;
    value.field_2._8_8_ = this_00._M_p;
    if (FVar5 == 1) {
      input_01._M_str = (char *)0x1;
      input_01._M_len = (size_t)pFVar1;
      protobuf::(anonymous_namespace)::ToCamelCase_abi_cxx11_
                (&lowercase_name,(_anonymous_namespace_ *)this_00._M_p,input_01,(bool)lower_first);
      this_03 = (AllocatedData)local_208._16_8_;
      local_d0._M_len = lowercase_name._M_string_length;
      local_d0._M_str = lowercase_name._M_dataplus._M_p;
      local_c0 = anon_unknown_24::
                 FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                 ::AllocatePlaceholderNames::kNullChar;
      local_b0 = (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                  *)local_208._24_8_;
      pFStack_a8 = (PointerT<google::protobuf::FeatureSet>)local_210.ptr_;
      local_a0._M_str = pcVar25;
      local_a0._M_len = uVar14;
      local_90 = (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                  *)local_208._0_8_;
      pFStack_88 = (PointerT<google::protobuf::FeatureSet>)local_208._8_8_;
      local_80 = anon_unknown_24::
                 FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                 ::AllocatePlaceholderNames::kNullChar;
      value._M_string_length = (size_type)pcVar23;
      value._M_dataplus._M_p = this_00._M_p;
      value.field_2._M_allocated_capacity = (size_type)(this_00._M_p + 1);
      sizes_01._M_len = 8;
      sizes_01._M_array = (iterator)&value;
      bytes_01._M_len = 6;
      bytes_01._M_array = &local_d0;
      oVar27 = anon_unknown_24::
               FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ::CreateDescriptorNames
                         ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           *)local_208._16_8_,bytes_01,sizes_01);
      _Var8 = oVar27.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
              _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
              _M_payload;
      uVar21 = oVar27.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
               _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
               _8_4_;
      goto LAB_001d8ac1;
    }
    if (FVar5 != 0) goto LAB_001d88b6;
    local_d0._M_len = local_208._24_8_;
    local_d0._M_str = (char *)local_210.ptr_;
    local_c0._M_str = pcVar25;
    local_c0._M_len = uVar14;
    local_b0 = (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                *)local_208._0_8_;
    pFStack_a8 = (PointerT<google::protobuf::FeatureSet>)local_208._8_8_;
    local_a0 = anon_unknown_24::
               FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ::AllocatePlaceholderNames::kNullChar;
    value._M_string_length = (size_type)pcVar23;
    value._M_dataplus._M_p = this_00._M_p;
    value.field_2._M_allocated_capacity = (size_type)(this_00._M_p + 1);
    sizes._M_len = 8;
    sizes._M_array = (iterator)&value;
    bytes._M_len = 4;
    bytes._M_array = &local_d0;
    oVar27 = anon_unknown_24::
             FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ::CreateDescriptorNames
                       ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         *)local_208._16_8_,bytes,sizes);
    _Var8 = oVar27.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
            _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
            _M_payload;
    uVar21 = oVar27.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
             _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
             _8_4_;
  }
  else {
LAB_001d88b6:
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&lowercase_name,
               (basic_string_view<char,_std::char_traits<char>_> *)local_208,
               (allocator<char> *)&local_d0);
    absl::lts_20250127::AsciiStrToLower(&lowercase_name);
    pcVar19 = (char *)0x1;
    input._M_str = (char *)0x1;
    input._M_len = local_208._8_8_;
    protobuf::(anonymous_namespace)::ToCamelCase_abi_cxx11_
              (&camelcase_name,(_anonymous_namespace_ *)local_208._0_8_,input,(bool)lower_first);
    if (psVar24 == (string *)0x0) {
      input_00._M_str = pcVar19;
      input_00._M_len = local_208._8_8_;
      protobuf::(anonymous_namespace)::ToJsonName_abi_cxx11_
                (&json_name,(_anonymous_namespace_ *)local_208._0_8_,input_00);
    }
    else {
      std::__cxx11::string::string((string *)&json_name,psVar24);
    }
    this_03 = (AllocatedData)local_208._16_8_;
    local_d0._M_len = json_name._M_string_length;
    local_d0._M_str = json_name._M_dataplus._M_p;
    local_c0 = anon_unknown_24::
               FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ::AllocatePlaceholderNames::kNullChar;
    local_b0 = (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                *)camelcase_name._M_string_length;
    pFStack_a8 = (PointerT<google::protobuf::FeatureSet>)camelcase_name._M_dataplus._M_p;
    local_a0 = anon_unknown_24::
               FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ::AllocatePlaceholderNames::kNullChar;
    local_90 = (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                *)lowercase_name._M_string_length;
    pFStack_88 = (PointerT<google::protobuf::FeatureSet>)lowercase_name._M_dataplus._M_p;
    local_80 = anon_unknown_24::
               FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ::AllocatePlaceholderNames::kNullChar;
    local_70 = (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                *)local_208._24_8_;
    local_68 = (PointerT<google::protobuf::SourceCodeInfo>)local_210.ptr_;
    local_50 = (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                *)local_208._0_8_;
    pFStack_48 = (PointerT<google::protobuf::FeatureSet>)local_208._8_8_;
    local_40 = anon_unknown_24::
               FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ::AllocatePlaceholderNames::kNullChar;
    value._M_string_length = (size_type)pcVar23;
    value._M_dataplus._M_p = (pointer)local_208._0_8_;
    value.field_2._M_allocated_capacity = (size_type)(pcVar23 + lowercase_name._M_string_length + 2)
    ;
    value.field_2._8_8_ = lowercase_name._M_string_length;
    sizes_00._M_len = 8;
    sizes_00._M_array = (iterator)&value;
    bytes_00._M_len = 10;
    bytes_00._M_array = &local_d0;
    local_60 = uVar14;
    local_58 = pcVar25;
    oVar27 = anon_unknown_24::
             FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ::CreateDescriptorNames
                       ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         *)local_208._16_8_,bytes_00,sizes_00);
    _Var8 = oVar27.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
            _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
            _M_payload;
    uVar21 = oVar27.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
             _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
             _8_4_;
    std::__cxx11::string::~string((string *)&json_name);
    std::__cxx11::string::~string((string *)&camelcase_name);
LAB_001d8ac1:
    std::__cxx11::string::~string((string *)&lowercase_name);
  }
  this_01 = local_208._40_8_;
  proto_00 = local_208._32_8_;
  if ((uVar21 & 1) == 0) {
    if ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
         *)local_208._24_8_ ==
        (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
         *)0x0) {
      std::__cxx11::string::string
                ((string *)&camelcase_name,
                 (string *)
                 ((ulong)((Base<google::protobuf::FileDescriptorTables> *)(local_208._32_8_ + 0x18))
                         ->value & 0xfffffffffffffffc));
    }
    else {
      local_d0._M_len = local_208._24_8_;
      local_d0._M_str = (char *)local_210.ptr_;
      value._0_16_ = absl::lts_20250127::NullSafeStringView(".");
      psVar9 = (size_type *)
               ((ulong)((Base<google::protobuf::FileDescriptorTables> *)(proto_00 + 0x18))->value &
               0xfffffffffffffffc);
      lowercase_name._M_string_length = *psVar9;
      lowercase_name._M_dataplus._M_p = (pointer)psVar9[1];
      absl::lts_20250127::StrCat_abi_cxx11_
                (&camelcase_name,(lts_20250127 *)&local_d0,(AlphaNum *)&value,
                 (AlphaNum *)&lowercase_name,(AlphaNum *)&value);
    }
    element_name._M_str = camelcase_name._M_dataplus._M_p;
    element_name._M_len = camelcase_name._M_string_length;
    AddError((DescriptorBuilder *)this_01,element_name,(Message *)proto_00,NAME,"Name too long.");
    std::__cxx11::string::~string((string *)&camelcase_name);
    name._M_str = "unknown";
    name._M_len = 7;
    oVar27 = anon_unknown_24::
             FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ::AllocateEntityNames
                       ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         *)this_03.flat,(string_view)(ZEXT816(0x34a06c) << 0x40),name);
    _Var8 = oVar27.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
            _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
            _M_payload;
    if (((undefined1  [16])
         oVar27.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
         _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames> &
        (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__throw_bad_optional_access();
    }
  }
  (result_local->all_names_).payload_ = (char *)_Var8;
  puVar10 = (undefined8 *)
            ((ulong)((Base<google::protobuf::FileDescriptorTables> *)(proto_00 + 0x18))->value &
            0xfffffffffffffffc);
  full_name._M_len = (ulong)*(ushort *)((long)_Var8 + 2);
  full_name._M_str = (char *)(~full_name._M_len + (long)_Var8);
  name_01._M_str = (char *)*puVar10;
  name_01._M_len = puVar10[1];
  ValidateSymbolName((DescriptorBuilder *)this_01,name_01,full_name,(Message *)proto_00);
  result_local->file_ =
       (FileDescriptor *)
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(this_01 + 0xa8))[1]._M_allocated_capacity;
  result_local->number_ =
       *(int *)&((Base<google::protobuf::ExtensionRangeOptions> *)(proto_00 + 0x48))->value;
  result_local->field_0x1 = result_local->field_0x1 & 0xf7 | is_extension * '\b';
  result_local->field_0x1 = result_local->field_0x1 & 0xef;
  result_local->field_0x3 = result_local->field_0x3 & 0xfe;
  result_local->field_0x1 =
       result_local->field_0x1 & 0xfd |
       *(char *)&((Base<google::protobuf::OneofOptions> *)(proto_00 + 0x50))->value * '\x02';
  result_local->field_0x3 = result_local->field_0x3 | 6;
  if ((*(char *)&((Base<google::protobuf::OneofOptions> *)(proto_00 + 0x50))->value == '\x01') &&
     (*(int *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(this_01 + 0xa8))[1]._M_allocated_capacity + 0x20) != 999)) {
    local_d0._M_len = (size_t)&result_local;
    pcVar25 = (result_local->all_names_).payload_;
    element_name_00._M_len = (ulong)*(ushort *)(pcVar25 + 2);
    element_name_00._M_str = pcVar25 + ~element_name_00._M_len;
    make_error.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
    ;
    make_error.ptr_.obj = &local_d0;
    AddError((DescriptorBuilder *)this_01,element_name_00,(Message *)proto_00,TYPE,make_error);
  }
  result_local->field_0x1 = result_local->field_0x1 & 0xfb | *(byte *)(proto_00 + 0x10) >> 2 & 4;
  result_local->type_ =
       *(uint8_t *)
        &(((PointerT<google::protobuf::EnumOptions>)(proto_00 + 0x58))->super_Message).
         super_MessageLite._vptr_MessageLite;
  result_local->field_0x1 = result_local->field_0x1 & 0x3f | *(char *)(proto_00 + 0x54) << 6;
  result_local->field_0x1 =
       result_local->field_0x1 & 0xdf | (0xbf < (byte)result_local->field_0x1) << 5;
  bVar17 = result_local->field_0x1;
  if ((bVar17 & 200) == 0x88) {
    pcVar25 = (result_local->all_names_).payload_;
    element_name_01._M_len = (ulong)*(ushort *)(pcVar25 + 2);
    element_name_01._M_str = pcVar25 + ~element_name_01._M_len;
    local_d0._M_len = (size_t)&result_local;
    make_error_00.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
    ;
    make_error_00.ptr_.obj = &local_d0;
    AddError((DescriptorBuilder *)this_01,element_name_01,(Message *)proto_00,TYPE,make_error_00);
    bVar17 = result_local->field_0x1;
    this_03 = (AllocatedData)local_208._16_8_;
  }
  (result_local->field_20).default_value_int64_t_ = 0;
  result_local->type_once_ = (once_flag *)0x0;
  result_local->containing_type_ = (Descriptor *)0x0;
  result_local->field_0x1 = bVar17 & 0xfe | *(byte *)(proto_00 + 0x10) >> 3 & 1;
  if (((*(byte *)(proto_00 + 0x10) & 8) != 0) &&
     (bVar4 = FieldDescriptor::is_repeated(result_local), bVar4)) {
    pcVar25 = (result_local->all_names_).payload_;
    element_name_02._M_len = (ulong)*(ushort *)(pcVar25 + 2);
    element_name_02._M_str = pcVar25 + ~element_name_02._M_len;
    AddError((DescriptorBuilder *)this_01,element_name_02,(Message *)proto_00,DEFAULT_VALUE,
             "Repeated fields can\'t have default values.");
  }
  if ((*(uint *)(proto_00 + 0x10) >> 10 & 1) == 0) goto switchD_001d8ed2_default;
  if ((*(uint *)(proto_00 + 0x10) & 8) == 0) {
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)result_local->type_ * 4)) {
    case 1:
    case 3:
    case 6:
      (result_local->field_20).default_value_int32_t_ = 0;
      break;
    case 2:
    case 4:
    case 5:
    case 8:
      (result_local->field_20).default_value_int64_t_ = 0;
      break;
    case 7:
      (result_local->field_20).default_value_bool_ = false;
      break;
    case 9:
      internal::InitProtobufDefaults();
      (result_local->field_20).default_value_double_ = (double)&internal::fixed_address_empty_string
      ;
      break;
    case 10:
      LOCK();
      (result_local->field_20).default_value_int64_t_ = 0;
      UNLOCK();
    }
    goto switchD_001d8ed2_default;
  }
  lowercase_name._M_dataplus._M_p = (pointer)0x0;
  bVar17 = result_local->type_;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (long)(ulong)bVar17 * 4)) {
  case 1:
    lVar13 = strtol(*(char **)((ulong)((Base<google::protobuf::FieldOptions> *)(proto_00 + 0x30))->
                                      value & 0xfffffffffffffffc),(char **)&lowercase_name,0);
    iVar6 = (int32_t)lVar13;
    goto LAB_001d92ad;
  case 2:
    psVar16 = (string *)
              strtoll(*(char **)((ulong)((Base<google::protobuf::FieldOptions> *)(proto_00 + 0x30))
                                        ->value & 0xfffffffffffffffc),(char **)&lowercase_name,0);
    goto LAB_001d949a;
  case 3:
    uVar14 = strtoul(*(char **)((ulong)((Base<google::protobuf::FieldOptions> *)(proto_00 + 0x30))->
                                       value & 0xfffffffffffffffc),(char **)&lowercase_name,0);
    iVar6 = (int32_t)uVar14;
LAB_001d92ad:
    (result_local->field_20).default_value_int32_t_ = iVar6;
    break;
  case 4:
    psVar16 = (string *)
              strtoull(*(char **)((ulong)((Base<google::protobuf::FieldOptions> *)(proto_00 + 0x30))
                                         ->value & 0xfffffffffffffffc),(char **)&lowercase_name,0);
LAB_001d949a:
    (result_local->field_20).default_value_string_ = psVar16;
    break;
  case 5:
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((ulong)((Base<google::protobuf::FieldOptions> *)(proto_00 + 0x30))->
                                    value & 0xfffffffffffffffc),"inf");
    if (bVar4) {
      iVar20 = 0x7ff0000000000000;
    }
    else {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((ulong)((Base<google::protobuf::FieldOptions> *)(proto_00 + 0x30))->
                                      value & 0xfffffffffffffffc),"-inf");
      if (bVar4) {
        iVar20 = -0x10000000000000;
      }
      else {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((ulong)((Base<google::protobuf::FieldOptions> *)(proto_00 + 0x30))
                                         ->value & 0xfffffffffffffffc),"nan");
        if (!bVar4) {
          dVar3 = io::NoLocaleStrtod(*(char **)((ulong)((Base<google::protobuf::FieldOptions> *)
                                                       (proto_00 + 0x30))->value &
                                               0xfffffffffffffffc),(char **)&lowercase_name);
          (result_local->field_20).default_value_double_ = dVar3;
          break;
        }
        iVar20 = 0x7ff8000000000000;
      }
    }
    (result_local->field_20).default_value_int64_t_ = iVar20;
    break;
  case 6:
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((ulong)((Base<google::protobuf::FieldOptions> *)(proto_00 + 0x30))->
                                    value & 0xfffffffffffffffc),"inf");
    if (bVar4) {
      (result_local->field_20).default_value_int32_t_ = 0x7f800000;
    }
    else {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((ulong)((Base<google::protobuf::FieldOptions> *)(proto_00 + 0x30))->
                                      value & 0xfffffffffffffffc),"-inf");
      if (bVar4) {
        (result_local->field_20).default_value_int32_t_ = -0x800000;
      }
      else {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((ulong)((Base<google::protobuf::FieldOptions> *)(proto_00 + 0x30))
                                         ->value & 0xfffffffffffffffc),"nan");
        if (bVar4) {
          (result_local->field_20).default_value_int32_t_ = 0x7fc00000;
        }
        else {
          dVar3 = io::NoLocaleStrtod(*(char **)((ulong)((Base<google::protobuf::FieldOptions> *)
                                                       (proto_00 + 0x30))->value &
                                               0xfffffffffffffffc),(char **)&lowercase_name);
          fVar26 = io::SafeDoubleToFloat(dVar3);
          (result_local->field_20).default_value_float_ = fVar26;
        }
      }
    }
    break;
  case 7:
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((ulong)((Base<google::protobuf::FieldOptions> *)(proto_00 + 0x30))->
                                    value & 0xfffffffffffffffc),"true");
    if (bVar4) {
      (result_local->field_20).default_value_bool_ = true;
    }
    else {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((ulong)((Base<google::protobuf::FieldOptions> *)(proto_00 + 0x30))->
                                      value & 0xfffffffffffffffc),"false");
      if (bVar4) {
        (result_local->field_20).default_value_bool_ = false;
      }
      else {
        pcVar25 = (result_local->all_names_).payload_;
        element_name_10._M_len = (ulong)*(ushort *)(pcVar25 + 2);
        element_name_10._M_str = pcVar25 + ~element_name_10._M_len;
        AddError((DescriptorBuilder *)this_01,element_name_10,(Message *)proto_00,DEFAULT_VALUE,
                 "Boolean default must be true or false.");
      }
    }
    break;
  case 8:
    (result_local->field_20).default_value_int64_t_ = 0;
    break;
  case 9:
    if (bVar17 != 0xc) {
      psVar16 = protobuf::(anonymous_namespace)::
                FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                ::AllocateStrings<std::__cxx11::string_const&>
                          ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                            *)this_03.flat,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((ulong)((Base<google::protobuf::FieldOptions> *)(proto_00 + 0x30))->
                                   value & 0xfffffffffffffffc));
      goto LAB_001d949a;
    }
    value._M_string_length = 0;
    value._M_dataplus._M_p = (pointer)&value.field_2;
    value.field_2._M_allocated_capacity = value.field_2._M_allocated_capacity & 0xffffffffffffff00;
    psVar15 = (size_t *)
              ((ulong)((Base<google::protobuf::FieldOptions> *)(proto_00 + 0x30))->value &
              0xfffffffffffffffc);
    source._M_str = (char *)&value;
    source._M_len = *psVar15;
    bVar4 = absl::lts_20250127::CUnescape
                      ((lts_20250127 *)psVar15[1],source,(Nonnull<std::string_*>)(ulong)bVar17);
    if (bVar4) {
      this_02 = (EnumValueDescriptor *)
                protobuf::(anonymous_namespace)::
                FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                ::AllocateArray<std::__cxx11::string>
                          ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                            *)this_03.flat,1);
      std::__cxx11::string::string((string *)&local_d0,(string *)&value);
      std::__cxx11::string::operator=((string *)this_02,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      (result_local->field_20).default_value_enum_ = this_02;
    }
    else {
      pcVar25 = (result_local->all_names_).payload_;
      element_name_11._M_len = (ulong)*(ushort *)(pcVar25 + 2);
      element_name_11._M_str = pcVar25 + ~element_name_11._M_len;
      AddError((DescriptorBuilder *)this_01,element_name_11,(Message *)proto_00,DEFAULT_VALUE,
               "Invalid escaping in default value.");
    }
    std::__cxx11::string::~string((string *)&value);
    break;
  case 10:
    pcVar25 = (result_local->all_names_).payload_;
    element_name_09._M_len = (ulong)*(ushort *)(pcVar25 + 2);
    element_name_09._M_str = pcVar25 + ~element_name_09._M_len;
    AddError((DescriptorBuilder *)this_01,element_name_09,(Message *)proto_00,DEFAULT_VALUE,
             "Messages can\'t have default values.");
    result_local->field_0x1 = result_local->field_0x1 & 0xfe;
    LOCK();
    (result_local->field_20).default_value_int64_t_ = 0;
    UNLOCK();
  }
  if ((lowercase_name._M_dataplus._M_p != (pointer)0x0) &&
     ((*(long *)(((ulong)((Base<google::protobuf::FieldOptions> *)(proto_00 + 0x30))->value &
                 0xfffffffffffffffc) + 8) == 0 || (*lowercase_name._M_dataplus._M_p != '\0')))) {
    pcVar25 = (result_local->all_names_).payload_;
    element_name_12._M_len = (ulong)*(ushort *)(pcVar25 + 2);
    element_name_12._M_str = pcVar25 + ~element_name_12._M_len;
    local_d0._M_len = proto_00;
    make_error_03.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
    ;
    make_error_03.ptr_.obj = &local_d0;
    AddError((DescriptorBuilder *)this_01,element_name_12,(Message *)proto_00,DEFAULT_VALUE,
             make_error_03);
  }
switchD_001d8ed2_default:
  if (result_local->number_ < 1) {
    pMVar11 = absl::lts_20250127::container_internal::
              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
              ::
              operator[]<google::protobuf::Descriptor*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>>
                        ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                          *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(this_01 + 0xa8) + 4),&parent_local);
    iVar22 = -1;
    if (-1 < pMVar11->fields_to_suggest) {
      iVar22 = pMVar11->fields_to_suggest;
    }
    uVar21 = iVar22 + 1;
    if (0x1ffffffe < uVar21) {
      uVar21 = 0x1fffffff;
    }
    pMVar11->fields_to_suggest = uVar21;
    if (pMVar11->first_reason == (Message *)0x0) {
      pMVar11->first_reason = (Message *)proto_00;
      pMVar11->first_reason_location = NUMBER;
    }
    pcVar25 = (result_local->all_names_).payload_;
    element_name_04._M_len = (ulong)*(ushort *)(pcVar25 + 2);
    element_name_04._M_str = pcVar25 + ~element_name_04._M_len;
    AddError((DescriptorBuilder *)this_01,element_name_04,(Message *)proto_00,NUMBER,
             "Field numbers must be positive integers.");
    if (is_extension) goto LAB_001d8f4f;
  }
  else {
    if (is_extension) {
LAB_001d8f4f:
      if ((*(byte *)(proto_00 + 0x10) & 2) == 0) {
        pcVar25 = (result_local->all_names_).payload_;
        element_name_05._M_len = (ulong)*(ushort *)(pcVar25 + 2);
        element_name_05._M_str = pcVar25 + ~element_name_05._M_len;
        AddError((DescriptorBuilder *)this_01,element_name_05,(Message *)proto_00,EXTENDEE,
                 "FieldDescriptorProto.extendee not set for extension field.");
      }
      (result_local->scope_).extension_scope = parent_local;
      if ((*(byte *)(proto_00 + 0x10) & 0x80) != 0) {
        pcVar25 = (result_local->all_names_).payload_;
        element_name_06._M_len = (ulong)*(ushort *)(pcVar25 + 2);
        element_name_06._M_str = pcVar25 + ~element_name_06._M_len;
        AddError((DescriptorBuilder *)this_01,element_name_06,(Message *)proto_00,TYPE,
                 "FieldDescriptorProto.oneof_index should not be set for extensions.");
      }
      goto LAB_001d90f5;
    }
    if (0x1fffffff < (uint)result_local->number_) {
      pMVar11 = absl::lts_20250127::container_internal::
                raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                ::
                operator[]<google::protobuf::Descriptor*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>>
                          ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                            *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)(this_01 + 0xa8) + 4),&parent_local);
      iVar22 = -1;
      if (-1 < pMVar11->fields_to_suggest) {
        iVar22 = pMVar11->fields_to_suggest;
      }
      uVar21 = iVar22 + 1;
      if (0x1ffffffe < uVar21) {
        uVar21 = 0x1fffffff;
      }
      pMVar11->fields_to_suggest = uVar21;
      if (pMVar11->first_reason == (Message *)0x0) {
        pMVar11->first_reason = (Message *)proto_00;
        pMVar11->first_reason_location = NUMBER;
      }
      pcVar25 = (result_local->all_names_).payload_;
      element_name_03._M_len = (ulong)*(ushort *)(pcVar25 + 2);
      element_name_03._M_str = pcVar25 + ~element_name_03._M_len;
      make_error_01.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__3,std::__cxx11::string>
      ;
      make_error_01.ptr_.obj = &local_d0;
      AddError((DescriptorBuilder *)this_01,element_name_03,(Message *)proto_00,NUMBER,make_error_01
              );
    }
  }
  cVar18 = (char)*(uint *)(proto_00 + 0x10);
  if ((*(uint *)(proto_00 + 0x10) & 2) != 0) {
    pcVar25 = (result_local->all_names_).payload_;
    element_name_07._M_len = (ulong)*(ushort *)(pcVar25 + 2);
    element_name_07._M_str = pcVar25 + ~element_name_07._M_len;
    AddError((DescriptorBuilder *)this_01,element_name_07,(Message *)proto_00,EXTENDEE,
             "FieldDescriptorProto.extendee set for non-extension field.");
    cVar18 = (char)*(undefined4 *)(proto_00 + 0x10);
  }
  result_local->containing_type_ = parent_local;
  if (cVar18 < '\0') {
    if ((*(int *)(proto_00 + 0x4c) < 0) ||
       (parent_local->oneof_decl_count_ <= *(int *)(proto_00 + 0x4c))) {
      pcVar25 = (result_local->all_names_).payload_;
      element_name_08._M_len = (ulong)*(ushort *)(pcVar25 + 2);
      element_name_08._M_str = pcVar25 + ~element_name_08._M_len;
      local_d0._M_len = proto_00;
      local_d0._M_str = (char *)&parent_local;
      make_error_02.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::BuildFieldOrExtension(google::protobuf::FieldDescriptorProto_const&,google::protobuf::Descriptor*,google::protobuf::FieldDescriptor*,bool,google::protobuf::internal::FlatAllocator&)::__4,std::__cxx11::string>
      ;
      make_error_02.ptr_.obj = &local_d0;
      AddError((DescriptorBuilder *)this_01,element_name_08,(Message *)proto_00,TYPE,make_error_02);
    }
    else {
      result_local->field_0x1 = result_local->field_0x1 | 0x10;
      pOVar12 = Descriptor::oneof_decl(parent_local,*(int *)(proto_00 + 0x4c));
      (result_local->scope_).containing_oneof = pOVar12;
      result_local->field_0x3 =
           (result_local->field_0x3 & 0xfe | (byte)result_local->field_0x1 >> 1 & 1) ^ 1;
    }
  }
LAB_001d90f5:
  option_name._M_str = "google.protobuf.FieldOptions";
  option_name._M_len = 0x1c;
  AllocateOptions<google::protobuf::FieldDescriptor>
            ((DescriptorBuilder *)this_01,(Proto *)proto_00,result_local,8,option_name,
             (FlatAllocator *)this_03.flat);
  puVar2 = (ushort *)(result_local->all_names_).payload_;
  full_name_00._M_len = (ulong)puVar2[1];
  full_name_00._M_str = (char *)((long)puVar2 + ~full_name_00._M_len);
  name_02._M_len = (ulong)*puVar2;
  name_02._M_str = (char *)((long)puVar2 + ~name_02._M_len);
  (result_local->super_SymbolBase).symbol_type_ = '\x02';
  AddSymbol((DescriptorBuilder *)this_01,full_name_00,parent_local,name_02,(Message *)proto_00,
            (Symbol)result_local);
  return;
}

Assistant:

void DescriptorBuilder::BuildFieldOrExtension(const FieldDescriptorProto& proto,
                                              Descriptor* parent,
                                              FieldDescriptor* result,
                                              bool is_extension,
                                              internal::FlatAllocator& alloc) {
  const absl::string_view scope =
      (parent == nullptr) ? file_->package() : parent->full_name();

  // We allocate all names in a single array, and dedup them.
  if (auto names = alloc.AllocateFieldNames(
          proto.name(), scope,
          proto.has_json_name() ? &proto.json_name() : nullptr)) {
    result->all_names_ = *names;
  } else {
    AddError(
        scope.empty() ? proto.name() : absl::StrCat(scope, ".", proto.name()),
        proto, DescriptorPool::ErrorCollector::NAME, "Name too long.");
    result->all_names_ = alloc.AllocateEntityNames("", "unknown").value();
  }

  ValidateSymbolName(proto.name(), result->full_name(), proto);

  result->file_ = file_;
  result->number_ = proto.number();
  result->is_extension_ = is_extension;
  result->is_oneof_ = false;
  result->in_real_oneof_ = false;
  result->proto3_optional_ = proto.proto3_optional();
  result->legacy_proto_ctype_ = FieldOptions::CType_MAX + 1;

  if (proto.proto3_optional() && file_->edition() != Edition::EDITION_PROTO3) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             [&] {
               return absl::StrCat(
                   "The [proto3_optional=true] option may only be set on proto3"
                   "fields, not ",
                   result->full_name());
             });
  }

  result->has_json_name_ = proto.has_json_name();

  result->type_ = proto.type();
  result->label_ = proto.label();
  result->is_repeated_ = result->label_ == FieldDescriptor::LABEL_REPEATED;

  if (result->label_ == FieldDescriptor::LABEL_REQUIRED) {
    // An extension cannot have a required field (b/13365836).
    if (result->is_extension_) {
      AddError(result->full_name(), proto,
               // Error location `TYPE`: we would really like to indicate
               // `LABEL`, but the `ErrorLocation` enum has no entry for this,
               // and we don't necessarily know about all implementations of the
               // `ErrorCollector` interface to extend them to handle the new
               // error location type properly.
               DescriptorPool::ErrorCollector::TYPE, [&] {
                 return absl::StrCat("The extension ", result->full_name(),
                                     " cannot be required.");
               });
    }
  }

  // Some of these may be filled in when cross-linking.
  result->containing_type_ = nullptr;
  result->type_once_ = nullptr;
  result->default_value_enum_ = nullptr;

  result->has_default_value_ = proto.has_default_value();
  if (proto.has_default_value() && result->is_repeated()) {
    AddError(result->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Repeated fields can't have default values.");
  }

  if (proto.has_type()) {
    if (proto.has_default_value()) {
      char* end_pos = nullptr;
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_t_ =
              std::strtol(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          static_assert(sizeof(int64_t) == sizeof(long long),  // NOLINT
                        "sizeof int64_t is not sizeof long long");
          result->default_value_int64_t_ =
              std::strtoll(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_t_ =
              std::strtoul(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          static_assert(
              sizeof(uint64_t) == sizeof(unsigned long long),  // NOLINT
              "sizeof uint64_t is not sizeof unsigned long long");
          result->default_value_uint64_t_ =
              std::strtoull(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          if (proto.default_value() == "inf") {
            result->default_value_float_ =
                std::numeric_limits<float>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_float_ =
                -std::numeric_limits<float>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_float_ =
                std::numeric_limits<float>::quiet_NaN();
          } else {
            result->default_value_float_ = io::SafeDoubleToFloat(
                io::NoLocaleStrtod(proto.default_value().c_str(), &end_pos));
          }
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          if (proto.default_value() == "inf") {
            result->default_value_double_ =
                std::numeric_limits<double>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_double_ =
                -std::numeric_limits<double>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_double_ =
                std::numeric_limits<double>::quiet_NaN();
          } else {
            result->default_value_double_ =
                io::NoLocaleStrtod(proto.default_value().c_str(), &end_pos);
          }
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          if (proto.default_value() == "true") {
            result->default_value_bool_ = true;
          } else if (proto.default_value() == "false") {
            result->default_value_bool_ = false;
          } else {
            AddError(result->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                     "Boolean default must be true or false.");
          }
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = nullptr;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          if (result->type() == FieldDescriptor::TYPE_BYTES) {
            std::string value;
            if (absl::CUnescape(proto.default_value(), &value)) {
              result->default_value_string_ = alloc.AllocateStrings(value);
            } else {
              AddError(result->full_name(), proto,
                       DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                       "Invalid escaping in default value.");
            }
          } else {
            result->default_value_string_ =
                alloc.AllocateStrings(proto.default_value());
          }
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Messages can't have default values.");
          result->has_default_value_ = false;
          result->default_generated_instance_ = nullptr;
          break;
      }

      if (end_pos != nullptr) {
        // end_pos is only set non-null by the parsers for numeric types,
        // above. This checks that the default was non-empty and had no extra
        // junk after the end of the number.
        if (proto.default_value().empty() || *end_pos != '\0') {
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE, [&] {
                     return absl::StrCat("Couldn't parse default value \"",
                                         proto.default_value(), "\".");
                   });
        }
      }
    } else {
      // No explicit default value
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_t_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_t_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_t_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_t_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          result->default_value_float_ = 0.0f;
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          result->default_value_double_ = 0.0;
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          result->default_value_bool_ = false;
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = nullptr;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          result->default_value_string_ = &internal::GetEmptyString();
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          result->default_generated_instance_ = nullptr;
          break;
      }
    }
  }

  if (result->number() <= 0) {
    message_hints_[parent].RequestHintOnFieldNumbers(
        proto, DescriptorPool::ErrorCollector::NUMBER);
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Field numbers must be positive integers.");
  } else if (!is_extension && result->number() > FieldDescriptor::kMaxNumber) {
    // Only validate that the number is within the valid field range if it is
    // not an extension. Since extension numbers are validated with the
    // extendee's valid set of extension numbers, and those are in turn
    // validated against the max allowed number, the check is unnecessary for
    // extension fields.
    // This avoids cross-linking issues that arise when attempting to check if
    // the extendee is a message_set_wire_format message, which has a higher max
    // on extension numbers.
    message_hints_[parent].RequestHintOnFieldNumbers(
        proto, DescriptorPool::ErrorCollector::NUMBER);
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             [&] {
               return absl::Substitute(
                   "Field numbers cannot be greater than $0.",
                   FieldDescriptor::kMaxNumber);
             });
  }

  if (is_extension) {
    if (!proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee not set for extension field.");
    }

    result->scope_.extension_scope = parent;

    if (proto.has_oneof_index()) {
      AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "FieldDescriptorProto.oneof_index should not be set for "
               "extensions.");
    }
  } else {
    if (proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee set for non-extension field.");
    }

    result->containing_type_ = parent;

    if (proto.has_oneof_index()) {
      if (proto.oneof_index() < 0 ||
          proto.oneof_index() >= parent->oneof_decl_count()) {
        AddError(result->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE, [&] {
                   return absl::Substitute(
                       "FieldDescriptorProto.oneof_index $0 is "
                       "out of range for type \"$1\".",
                       proto.oneof_index(), parent->name());
                 });
      } else {
        result->is_oneof_ = true;
        result->scope_.containing_oneof =
            parent->oneof_decl(proto.oneof_index());
        result->in_real_oneof_ = !result->proto3_optional_;
      }
    }
  }

  // Copy options.
  AllocateOptions(proto, result, FieldDescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.FieldOptions", alloc);

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));
}